

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::brokerRegistration(CoreBroker *this,ActionMessage *command)

{
  ushort uVar1;
  BrokerState BVar2;
  uint uVar3;
  GlobalFederateId GVar4;
  int iVar5;
  pointer pcVar6;
  size_type sVar7;
  string_view message;
  int32_t errorCode;
  uint16_t uVar8;
  bool bVar9;
  route_id rVar10;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var11;
  string *psVar12;
  mapped_type *pmVar13;
  pointer pBVar14;
  long lVar15;
  uint uVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view searchValue;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  optional<unsigned_long> oVar17;
  string_view fmt;
  format_args args;
  int32_t iStackY_170;
  route_id route;
  GlobalBrokerId global_brkid;
  string local_140;
  ActionMessage brokerReply;
  byte *local_68;
  size_t local_60;
  BaseType local_58;
  BaseType local_48;
  
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,command);
    return;
  }
  uVar1 = command->flags;
  if (command->counter == 0) {
    _Var11._M_current =
         (this->mBrokers).dataStorage.
         super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    searchValue._M_str = (char *)(command->payload).heap;
    searchValue._M_len = (command->payload).bufferSize;
    _Var11 = gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
             ::find(&this->mBrokers,searchValue);
    if (_Var11._M_current !=
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar3 = this->routeCount;
      this->routeCount = uVar3 + 1;
      uVar16 = uVar3 + 0xa000000;
      if ((uVar1 & 0x40) == 0) {
        uVar16 = uVar3;
      }
      ((_Var11._M_current)->route).rid = uVar16;
      uVar3 = (command->dest_handle).hid;
      psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
      (*(this->super_Broker)._vptr_Broker[0x24])
                (this,(ulong)uVar16,(ulong)uVar3,psVar12->_M_string_length,
                 (psVar12->_M_dataplus)._M_p);
      brokerReply.messageAction = ((_Var11._M_current)->global_id).gid;
      pmVar13 = CLI::std::__detail::
                _Map_base<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->routing_table,(key_type *)&brokerReply);
      pmVar13->rid = ((_Var11._M_current)->route).rid;
      ActionMessage::ActionMessage(&brokerReply,cmd_broker_ack);
      brokerReply.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      brokerReply.dest_id.gid = ((_Var11._M_current)->global_id).gid;
      name._M_str = (char *)(command->payload).heap;
      name._M_len = (command->payload).bufferSize;
      ActionMessage::name(&brokerReply,name);
      if ((this->super_BrokerBase).no_ping == true) {
        brokerReply.flags = brokerReply.flags | 0x4000;
      }
      bVar9 = (this->super_BrokerBase).asyncTime;
      if ((((this->super_BrokerBase).globalTime != false) ||
          (uVar8 = brokerReply.flags, (bVar9 & 1U) != 0)) &&
         (uVar8 = brokerReply.flags | 0x20, (bVar9 & 1U) != 0)) {
        uVar8 = brokerReply.flags | 0xa0;
      }
      brokerReply.flags = uVar8;
      (*(this->super_Broker)._vptr_Broker[0x22])
                (this,(ulong)(uint)((_Var11._M_current)->route).rid,&brokerReply);
      goto LAB_002c1e07;
    }
  }
  if ((this->super_BrokerBase).maxBrokerCount <=
      (int)(((long)_Var11._M_current -
            (long)(this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x58)) {
    iStackY_170 = 0xd;
    goto LAB_002c1e79;
  }
  BVar2 = (this->super_BrokerBase).brokerState._M_i;
  if (BVar2 < OPERATING) {
    bVar9 = allInitReady(this);
    if (bVar9) {
      ActionMessage::ActionMessage(&brokerReply,cmd_init_not_ready);
      brokerReply.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&brokerReply);
      ActionMessage::~ActionMessage(&brokerReply);
    }
  }
  else {
    if (BVar2 != OPERATING) {
      iStackY_170 = 0xe;
LAB_002c1e79:
      sendBrokerErrorAck(this,command,iStackY_170);
      return;
    }
    if (((command->flags & 0x100) == 0) && ((this->super_BrokerBase).dynamicFederation == false)) {
      iStackY_170 = 5;
      goto LAB_002c1e79;
    }
  }
  bVar9 = verifyBrokerKey(this,command);
  if (bVar9) {
    if ((command->flags & 0x2000) == 0) {
      brokerReply._0_8_ = (command->payload).bufferSize;
      brokerReply._8_8_ = (command->payload).heap;
      oVar17 = gmlc::containers::
               DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
               ::insert<std::basic_string_view<char,std::char_traits<char>>>
                         ((DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
                           *)&this->mBrokers);
      if (((undefined1  [16])
           oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        errorCode = 7;
        goto LAB_002c1fbc;
      }
      GVar4.gid = (command->source_id).gid;
      if (((GVar4.gid == -2010000000) || (GVar4.gid == 0)) || (GVar4.gid == -1700000000)) {
        uVar3 = this->routeCount;
        uVar16 = uVar3 + 0xa000000;
        if ((uVar1 & 0x40) == 0) {
          uVar16 = uVar3;
        }
        this->routeCount = uVar3 + 1;
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].route.rid = uVar16;
        uVar3 = (command->dest_handle).hid;
        psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
        (*(this->super_Broker)._vptr_Broker[0x24])
                  (this,(ulong)uVar16,(ulong)uVar3,psVar12->_M_string_length,
                   (psVar12->_M_dataplus)._M_p);
        pBVar14 = (this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar14[-1].parent.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pBVar14[-1]._nonLocal = false;
        pBVar14[-1]._route_key = true;
      }
      else {
        rVar10 = getRoute(this,GVar4);
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].route.rid = rVar10.rid;
        if (rVar10.rid == 0) {
          std::operator<<((ostream *)&std::cout," invalid route to parent broker or reg broker\n");
        }
        pBVar14 = (this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar14[-1].parent.gid = (command->source_id).gid;
        pBVar14[-1]._nonLocal = true;
      }
      uVar1 = command->flags;
      pBVar14[-1]._observer = (bool)((byte)(uVar1 >> 8) & 1);
      pBVar14 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar14[-1]._core = (bool)((byte)(uVar1 >> 3) & 1);
      if ((this->super_BrokerBase).field_0x294 == '\0') {
        iVar5 = (this->super_BrokerBase).global_broker_id_local.gid;
        if (((iVar5 != -2010000000) && (iVar5 != -1700000000)) && (iVar5 != 0)) {
          (command->source_id).gid = iVar5;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
          return;
        }
        gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::
        push<helics::ActionMessage&>
                  ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,
                   command);
        return;
      }
      lVar15 = ((long)pBVar14 -
               (long)(this->mBrokers).dataStorage.
                     super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x58;
      pBVar14[-1].global_id.gid = (int)lVar15 + 0x6fffffff;
      gmlc::containers::
      DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
      ::addSearchTermForIndex(&this->mBrokers,&pBVar14[-1].global_id,lVar15 - 1);
      pBVar14 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      global_brkid.gid = pBVar14[-1].global_id.gid;
      route.rid = pBVar14[-1].route.rid;
      if ((command->flags & 0x4000) != 0) {
        pBVar14[-1]._disable_ping = true;
      }
      std::
      _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
                ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->routing_table,&global_brkid,&route);
      ActionMessage::ActionMessage(&brokerReply,cmd_broker_ack);
      brokerReply.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      brokerReply.dest_id.gid = global_brkid.gid;
      name_01._M_str = (char *)(command->payload).heap;
      name_01._M_len = (command->payload).bufferSize;
      ActionMessage::name(&brokerReply,name_01);
      if ((this->super_BrokerBase).no_ping == true) {
        brokerReply.flags = brokerReply.flags | 0x4000;
      }
      bVar9 = (this->super_BrokerBase).asyncTime;
      if ((((this->super_BrokerBase).globalTime != false) ||
          (uVar8 = brokerReply.flags, (bVar9 & 1U) != 0)) &&
         (uVar8 = brokerReply.flags | 0x20, (bVar9 & 1U) != 0)) {
        uVar8 = brokerReply.flags | 0xa0;
      }
      brokerReply.flags = uVar8;
      if ((this->super_BrokerBase).globalDisconnect == true) {
        brokerReply.flags = brokerReply.flags | 0x800;
      }
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)route.rid,&brokerReply);
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        GVar4.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar6 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar7 = (this->super_BrokerBase).identifier._M_string_length;
        local_60 = (command->payload).bufferSize;
        local_68 = (command->payload).heap;
        local_58 = global_brkid.gid;
        local_48 = route.rid;
        fmt.size_ = 0x11d;
        fmt.data_ = (char *)0x25;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_140,(v11 *)"registering broker {}({}) on route {}",fmt,args);
        message._M_str = local_140._M_dataplus._M_p;
        message._M_len = local_140._M_string_length;
        name_02._M_str = pcVar6;
        name_02._M_len = sVar7;
        BrokerBase::sendToLogger(&this->super_BrokerBase,GVar4,9,name_02,message,false);
        std::__cxx11::string::~string((string *)&local_140);
      }
    }
    else {
      GVar4.gid = (command->source_id).gid;
      if (((GVar4.gid == -2010000000) || (GVar4.gid == 0)) || (GVar4.gid == -1700000000)) {
        uVar3 = this->routeCount;
        this->routeCount = uVar3 + 1;
        rVar10.rid = uVar3 + 0xa000000;
        if ((uVar1 & 0x40) == 0) {
          rVar10.rid = uVar3;
        }
        uVar3 = (command->dest_handle).hid;
        psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
        (*(this->super_Broker)._vptr_Broker[0x24])
                  (this,(ulong)(uint)rVar10.rid,(ulong)uVar3,psVar12->_M_string_length,
                   (psVar12->_M_dataplus)._M_p);
        bVar9 = true;
      }
      else {
        rVar10 = getRoute(this,GVar4);
        bVar9 = false;
      }
      ActionMessage::ActionMessage(&brokerReply,cmd_broker_ack);
      brokerReply.flags = brokerReply.flags | 0x2010;
      brokerReply.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      name_00._M_str = (char *)(command->payload).heap;
      name_00._M_len = (command->payload).bufferSize;
      ActionMessage::name(&brokerReply,name_00);
      brokerReply.messageID = 0x133;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar10.rid);
      if (bVar9) {
        (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)rVar10.rid);
      }
    }
LAB_002c1e07:
    ActionMessage::~ActionMessage(&brokerReply);
    return;
  }
  errorCode = 9;
LAB_002c1fbc:
  sendBrokerErrorAck(this,command,errorCode);
  return;
}

Assistant:

void CoreBroker::brokerRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if (command.counter > 0) {  // this indicates it is a resend
        auto brk = mBrokers.find(command.name());
        if (brk != mBrokers.end()) {
            // we would get this if the ack didn't go through for some reason
            brk->route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(brk->route, command.getExtraData(), command.getString(targetStringLoc));
            routing_table[brk->global_id] = brk->route;

            // sending the response message
            ActionMessage brokerReply(CMD_BROKER_ACK);
            brokerReply.source_id = global_broker_id_local;  // source is global root
            brokerReply.dest_id = brk->global_id;  // the new id
            brokerReply.name(command.name());  // the identifier of the broker
            if (no_ping) {
                setActionFlag(brokerReply, slow_responding_flag);
            }
            if (globalTime || asyncTime) {
                setActionFlag(brokerReply, global_timing_flag);
                if (asyncTime) {
                    setActionFlag(brokerReply, async_timing_flag);
                }
            }
            transmit(brk->route, brokerReply);
            return;
        }
    }
    // check the max broker count
    if (static_cast<decltype(maxBrokerCount)>(mBrokers.size()) >= maxBrokerCount) {
        sendBrokerErrorAck(command, max_broker_count_exceeded);
        return;
    }

    auto currentBrokerState = getBrokerState();
    if (currentBrokerState < BrokerState::OPERATING) {
        if (allInitReady()) {
            // send an init not ready as we were ready now we are not
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (currentBrokerState == BrokerState::OPERATING) {
        // we are initialized already
        if (!checkActionFlag(command, observer_flag) && !dynamicFederation) {
            sendBrokerErrorAck(command, already_init_error_code);
            return;
        }
        // can't add a non observer federate in OPERATING mode unless this is a dynamicFederation
    } else {
        sendBrokerErrorAck(command, broker_terminating);
        return;
    }
    if (!verifyBrokerKey(command)) {
        sendBrokerErrorAck(command, mismatch_broker_key_error_code);
        return;
    }
    if (checkActionFlag(command, test_connection_flag)) {
        route_id newroute;
        bool route_created = false;
        if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
            newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
            route_created = true;
        } else {
            newroute = getRoute(command.source_id);
        }
        ActionMessage testInit(CMD_BROKER_ACK);
        setActionFlag(testInit, error_flag);
        setActionFlag(testInit, test_connection_flag);
        testInit.source_id = global_broker_id_local;
        testInit.name(command.name());
        testInit.messageID = CONNECTION_TEST;
        transmit(newroute, testInit);

        if (route_created) {
            removeRoute(newroute);
        }
        // this was a test connection and should not be added
        return;
    }
    auto inserted = mBrokers.insert(command.name(), no_search, command.name());
    if (!inserted) {
        sendBrokerErrorAck(command, duplicate_broker_name_error_code);
        return;
    }
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        // TODO(PT): this will need to be updated when we enable mesh routing
        mBrokers.back().route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(mBrokers.back().route, command.getExtraData(), command.getString(targetStringLoc));
        mBrokers.back().parent = global_broker_id_local;
        mBrokers.back()._nonLocal = false;
        mBrokers.back()._route_key = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    } else {
        mBrokers.back().route = getRoute(command.source_id);
        if (mBrokers.back().route == parent_route_id) {
            std::cout << " invalid route to parent broker or reg broker\n";
        }
        mBrokers.back().parent = command.source_id;
        mBrokers.back()._nonLocal = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    }
    mBrokers.back()._core = checkActionFlag(command, core_flag);
    if (!isRootc) {
        if ((global_broker_id_local.isValid()) && (global_broker_id_local != parent_broker_id)) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        mBrokers.back().global_id = GlobalBrokerId(
            static_cast<GlobalBrokerId::BaseType>(mBrokers.size()) - 1 + gGlobalBrokerIdShift);
        mBrokers.addSearchTermForIndex(mBrokers.back().global_id, mBrokers.size() - 1);
        auto global_brkid = mBrokers.back().global_id;
        auto route = mBrokers.back().route;
        if (checkActionFlag(command, slow_responding_flag)) {
            mBrokers.back()._disable_ping = true;
        }
        routing_table.emplace(global_brkid, route);

        // sending the response message
        ActionMessage brokerReply(CMD_BROKER_ACK);
        brokerReply.source_id = global_broker_id_local;  // source is global root
        brokerReply.dest_id = global_brkid;  // the new id
        brokerReply.name(command.name());  // the identifier of the broker
        if (no_ping) {
            setActionFlag(brokerReply, slow_responding_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(brokerReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(brokerReply, async_timing_flag);
            }
        }
        if (globalDisconnect) {
            setActionFlag(brokerReply, global_disconnect_flag);
        }
        transmit(route, brokerReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering broker {}({}) on route {}",
                                    command.name(),
                                    global_brkid.baseValue(),
                                    route.baseValue()));
    }
}